

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O1

void __thiscall xray_re::xr_reader::r_s(xr_reader *this,string *value)

{
  uint8_t *puVar1;
  pointer pcVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  
  puVar5 = (this->field_2).m_p;
  puVar1 = this->m_end;
  puVar3 = puVar5;
  if (puVar1 <= puVar5) {
    __assert_fail("p < m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                  ,0x7f,"void xray_re::xr_reader::r_s(std::string &)");
  }
  do {
    puVar4 = puVar3;
    if ((*puVar3 == '\n') || (*puVar3 == '\r')) break;
    puVar3 = puVar3 + 1;
    puVar4 = puVar1;
  } while (puVar3 != puVar1);
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_replace_dispatch<unsigned_char_const*>
            ((string *)value,pcVar2,pcVar2 + value->_M_string_length,puVar5,puVar4);
  puVar5 = puVar4;
  for (; (puVar4 != this->m_end && ((*puVar4 == '\r' || (puVar5 = puVar4, *puVar4 == '\n'))));
      puVar4 = puVar4 + 1) {
    puVar5 = this->m_end;
  }
  (this->field_2).m_p = puVar5;
  return;
}

Assistant:

void xr_reader::r_s(std::string& value)
{
	const uint8_t* p = m_p;
	xr_assert(p < m_end);
	while (p != m_end && *p != '\n' && *p != '\r')
		++p;
	value.assign(m_p, p);
	while (p != m_end && (*p == '\n' || *p == '\r'))
		++p;
	m_p = p;
}